

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.cpp
# Opt level: O1

FunctionBody * __thiscall
Js::JavascriptExceptionObject::GetFunctionBody(JavascriptExceptionObject *this)

{
  JavascriptFunction *this_00;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  FunctionBody *this_01;
  undefined4 *puVar4;
  
  this_00 = (this->exceptionContext).m_throwingFunction.ptr;
  if (this_00 != (JavascriptFunction *)0x0) {
    this_01 = (FunctionBody *)JavascriptFunction::GetParseableFunctionInfo(this_00);
    bVar2 = FunctionProxy::IsFunctionBody((FunctionProxy *)this_01);
    if (bVar2) {
      bVar3 = FunctionProxy::IsFunctionBody((FunctionProxy *)this_01);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      if (bVar2) {
        return this_01;
      }
    }
  }
  return (FunctionBody *)0x0;
}

Assistant:

FunctionBody* JavascriptExceptionObject::GetFunctionBody() const
    {
        // If it is a throwing function; it must be deserialized
        if (exceptionContext.ThrowingFunction())
        {
            ParseableFunctionInfo *info = exceptionContext.ThrowingFunction()->GetParseableFunctionInfo();
            if (info->IsFunctionBody())
            {
                return info->GetFunctionBody();
            }
        }
        return nullptr;
    }